

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_dateVal(Context *context,IntrinsicResult partialResult)

{
  TextOutputMethod *pp_Var1;
  long *plVar2;
  ValueType VVar3;
  Value *pVVar4;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar5;
  undefined8 *puVar6;
  anon_union_8_3_2f476f46_for_data aVar7;
  double dVar8;
  Value date;
  time_t t;
  undefined1 local_88 [16];
  Interpreter *local_78;
  anon_union_8_3_2f476f46_for_data local_70;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_68;
  anon_union_8_3_2f476f46_for_data local_60;
  Value local_58;
  Value local_48;
  double local_38;
  anon_union_8_3_2f476f46_for_data local_30 [3];
  
  local_60.tempNum._0_1_ = false;
  pDVar5 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar5->super_RefCountedStorage).refCount = 1;
  (pDVar5->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001bf0d8;
  pDVar5->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x8;
  pDVar5->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar6 = (undefined8 *)operator_new__(8);
  pDVar5->mSize = (long)puVar6;
  *puVar6 = 0x72745365746164;
  local_68 = pDVar5;
  MiniScript::Context::GetVar
            ((Context *)local_88,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  if ((local_68 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     ((bool)local_60.tempNum._0_1_ == false)) {
    plVar2 = &(local_68->super_RefCountedStorage).refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_68->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_68 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  if (local_88[0] == 1) {
    pVVar4 = &local_48;
    local_48.type = true;
    local_48.noInvoke = (bool)local_88[1];
    local_48.localOnly = local_88[2];
    local_48.data.ref = (RefCountedStorage *)local_88._8_8_;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_48);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar7 = local_48.data;
    VVar3 = local_48.type;
  }
  else {
    if (local_88[0] == 0) {
      time((time_t *)&local_30[0].tempNum);
      aVar7 = local_30[0];
    }
    else {
      MiniScript::Value::ToString((Value *)&local_78,(Machine *)local_88);
      aVar7 = (anon_union_8_3_2f476f46_for_data)MiniScript::ParseDate((String *)&local_78);
      local_30[0] = aVar7;
      if ((local_78 != (Interpreter *)0x0) && ((bool)local_70.tempNum._0_1_ == false)) {
        pp_Var1 = &local_78->standardOutput;
        *pp_Var1 = *pp_Var1 + -1;
        if (*pp_Var1 == (TextOutputMethod)0x0) {
          (*local_78->_vptr_Interpreter[1])();
        }
        local_78 = (Interpreter *)0x0;
      }
    }
    local_38 = (double)aVar7.number;
    dVar8 = dateTimeEpoch();
    local_58.data.number = local_38 - dVar8;
    pVVar4 = &local_58;
    local_58.type = Number;
    local_58.noInvoke = false;
    local_58.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_58);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar7 = local_58.data;
    VVar3 = local_58.type;
  }
  if ((Temp < VVar3) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)aVar7.ref !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    plVar2 = &(aVar7.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((RefCountedStorage *)&(aVar7.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])();
    }
    (pVVar4->data).number = 0.0;
  }
  if ((2 < local_88[0]) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_88._8_8_ !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    plVar2 = &((RefCountedStorage *)local_88._8_8_)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((RefCountedStorage *)local_88._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_dateVal(Context *context, IntrinsicResult partialResult) {
	Value date = context->GetVar("dateStr");
	time_t t;
	if (date.IsNull()) {
		time(&t);
	} else if (date.type == ValueType::Number) {
		return IntrinsicResult(date);
	} else {
		t = ParseDate(date.ToString());
	}
	return IntrinsicResult((double)t - dateTimeEpoch());
}